

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O2

int ipc_dialer_get(void *arg,char *nm,void *buf,size_t *szp,nni_type t)

{
  int iVar1;
  
  iVar1 = nni_getopt(ipc_dialer_options,nm,arg,buf,szp,t);
  return iVar1;
}

Assistant:

static int
ipc_dialer_get(void *arg, const char *name, void *buf, size_t *szp, nni_type t)
{
	ipc_ep *ep = arg;
	int     rv;

	rv = nni_getopt(ipc_ep_options, name, ep, buf, szp, t);
	if (rv == NNG_ENOTSUP) {
		rv = nni_stream_dialer_get(ep->dialer, name, buf, szp, t);
	}
	return (rv);
}